

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_xmlmodelserialiser.cpp
# Opt level: O2

void __thiscall tst_XmlModelSerialiser::validateXmlOutput_data(tst_XmlModelSerialiser *this)

{
  tst_SerialiserCommon *this_00;
  QTestData *pQVar1;
  QAbstractItemModel *local_30;
  
  QTest::addColumn<QAbstractItemModel_const*>("sourceModel",(QAbstractItemModel **)0x0);
  pQVar1 = (QTestData *)QTest::newRow("List Single Role");
  this_00 = &this->super_tst_SerialiserCommon;
  local_30 = tst_SerialiserCommon::createStringModel(this_00,&this->super_QObject);
  operator<<(pQVar1,&local_30);
  pQVar1 = (QTestData *)QTest::newRow("Table Single Role");
  local_30 = tst_SerialiserCommon::createComplexModel(this_00,false,false,&this->super_QObject);
  operator<<(pQVar1,&local_30);
  pQVar1 = (QTestData *)QTest::newRow("Table Multi Roles");
  local_30 = tst_SerialiserCommon::createComplexModel(this_00,false,true,&this->super_QObject);
  operator<<(pQVar1,&local_30);
  pQVar1 = (QTestData *)QTest::newRow("Tree Single Role");
  local_30 = tst_SerialiserCommon::createComplexModel(this_00,true,false,&this->super_QObject);
  operator<<(pQVar1,&local_30);
  pQVar1 = (QTestData *)QTest::newRow("Tree Multi Roles");
  local_30 = tst_SerialiserCommon::createComplexModel(this_00,true,true,&this->super_QObject);
  operator<<(pQVar1,&local_30);
  return;
}

Assistant:

void tst_XmlModelSerialiser::validateXmlOutput_data()
{
    QTest::addColumn<const QAbstractItemModel *>("sourceModel");
    QTest::newRow("List Single Role") << static_cast<const QAbstractItemModel *>(createStringModel(this));
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::newRow("Table Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, this));
    QTest::newRow("Table Multi Roles") << static_cast<const QAbstractItemModel *>(createComplexModel(false, true, this));
    QTest::newRow("Tree Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(true, false, this));
    QTest::newRow("Tree Multi Roles") << static_cast<const QAbstractItemModel *>(createComplexModel(true, true, this));
#endif
}